

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QPodArrayOps<double>::emplace<double&>
          (QPodArrayOps<double> *this,qsizetype i,double *args)

{
  double dVar1;
  Data *pDVar2;
  long lVar3;
  double *pdVar4;
  GrowthPosition where;
  
  pDVar2 = (this->super_QArrayDataPointer<double>).d;
  if ((pDVar2 != (Data *)0x0) &&
     ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2)) {
    lVar3 = (this->super_QArrayDataPointer<double>).size;
    if ((lVar3 == i) &&
       (pdVar4 = (this->super_QArrayDataPointer<double>).ptr,
       (pDVar2->super_QArrayData).alloc !=
       ((long)((long)pdVar4 -
              ((ulong)((long)&pDVar2[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 3) +
       i)) {
      pdVar4[i] = *args;
      (this->super_QArrayDataPointer<double>).size = i + 1;
      return;
    }
    if ((i == 0) &&
       (pdVar4 = (this->super_QArrayDataPointer<double>).ptr,
       (double *)((ulong)((long)&pDVar2[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) !=
       pdVar4)) {
      pdVar4[-1] = *args;
      (this->super_QArrayDataPointer<double>).ptr = pdVar4 + -1;
      (this->super_QArrayDataPointer<double>).size = lVar3 + 1;
      return;
    }
  }
  dVar1 = *args;
  where = (GrowthPosition)(i == 0 && (this->super_QArrayDataPointer<double>).size != 0);
  QArrayDataPointer<double>::detachAndGrow
            (&this->super_QArrayDataPointer<double>,where,1,(double **)0x0,
             (QArrayDataPointer<double> *)0x0);
  pdVar4 = createHole(this,where,i,1);
  *pdVar4 = dVar1;
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        typename QArrayData::GrowthPosition pos = QArrayData::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = QArrayData::GrowsAtBeginning;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        T *where = createHole(pos, i, 1);
        new (where) T(std::move(tmp));
    }